

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O0

double atand(double v)

{
  double in_XMM0_Qa;
  undefined8 local_8;
  
  if ((in_XMM0_Qa != -1.0) || (NAN(in_XMM0_Qa))) {
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      if ((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) {
        local_8 = atan(in_XMM0_Qa);
        local_8 = local_8 * 57.29577951308232;
      }
      else {
        local_8 = 45.0;
      }
    }
    else {
      local_8 = 0.0;
    }
  }
  else {
    local_8 = -45.0;
  }
  return local_8;
}

Assistant:

double atand(double v) {
    if (v == -1.0) {
        return -45.0;
    } else if (v == 0.0) {
        return 0.0;
    } else if (v == 1.0) {
        return 45.0;
    }

    return atan(v) * R2D;
}